

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_TestTargetLevelApi_Test::TestBody
          (LevelTest_TestTargetLevelApi_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int target_level;
  int level;
  int operating_point;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_enc_cfg_t cfg;
  aom_codec_ctx_t enc;
  aom_codec_iface_t *codec;
  int in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  aom_codec_ctx_t *in_stack_fffffffffffffad0;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffad8;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  undefined4 uVar2;
  char *in_stack_fffffffffffffae8;
  int line;
  aom_codec_enc_cfg_t *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  Type in_stack_fffffffffffffafc;
  aom_codec_ctx_t *in_stack_fffffffffffffb00;
  Message *in_stack_fffffffffffffb48;
  AssertHelper *in_stack_fffffffffffffb50;
  AssertionResult local_4a0 [2];
  aom_codec_err_t local_480;
  undefined4 local_47c;
  undefined1 local_478 [60];
  uint local_43c;
  uint local_438;
  uint local_434;
  aom_codec_err_t local_420;
  uint local_41c;
  AssertionResult local_418 [3];
  aom_codec_err_t local_3e8;
  uint local_3e4;
  AssertionResult local_3e0 [61];
  aom_codec_iface_t *local_10;
  
  local_10 = aom_codec_av1_cx();
  local_3e4 = 0;
  local_3e8 = aom_codec_enc_config_default
                        ((aom_codec_iface_t *)
                         CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                         in_stack_fffffffffffffad8,(uint)((ulong)in_stack_fffffffffffffad0 >> 0x20))
  ;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffae8,
             (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             &in_stack_fffffffffffffad8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb00);
    testing::AssertionResult::failure_message((AssertionResult *)0x8ad5b9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
               (char *)in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x8ad616);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ad66e);
  local_41c = 0;
  local_420 = aom_codec_enc_init_ver
                        (in_stack_fffffffffffffb00,
                         (aom_codec_iface_t *)
                         CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                         in_stack_fffffffffffffaf0,(aom_codec_flags_t)in_stack_fffffffffffffae8,
                         in_stack_fffffffffffffae4);
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffae8,
             (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             &in_stack_fffffffffffffad8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_418);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb00);
    testing::AssertionResult::failure_message((AssertionResult *)0x8ad73d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
               (char *)in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
    testing::Message::~Message((Message *)0x8ad79a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ad7f2);
  for (local_434 = 0; (int)local_434 < 0x21; local_434 = local_434 + 1) {
    for (local_438 = 0; (int)local_438 < 0x21; local_438 = local_438 + 1) {
      local_43c = local_434 * 100 + local_438;
      if (((int)local_434 < 0x20) &&
         (((((((int)local_438 < 0x14 && (local_438 != 2)) && (local_438 != 3)) &&
            ((local_438 != 6 && (local_438 != 7)))) && ((local_438 != 10 && (local_438 != 0xb)))) ||
          ((local_438 == 0x1f || (local_438 == 0x20)))))) {
        local_478._36_4_ = 0;
        local_478._32_4_ =
             aom_codec_control_typechecked_AV1E_SET_TARGET_SEQ_LEVEL_IDX
                       (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                        in_stack_fffffffffffffac8);
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffffae8,
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   &in_stack_fffffffffffffad8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffad0)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)(local_478 + 0x28));
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb00);
          in_stack_fffffffffffffb00 =
               (aom_codec_ctx_t *)
               testing::AssertionResult::failure_message((AssertionResult *)0x8ad967);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     (char *)in_stack_fffffffffffffaf0,
                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
          testing::Message::~Message((Message *)0x8ad9c4);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8ada19);
      }
      else {
        local_47c = 8;
        local_480 = aom_codec_control_typechecked_AV1E_SET_TARGET_SEQ_LEVEL_IDX
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffacc,
                               in_stack_fffffffffffffac8);
        in_stack_fffffffffffffaf0 = (aom_codec_enc_cfg_t *)local_478;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffffae8,
                   (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   &in_stack_fffffffffffffad8->g_usage,(aom_codec_err_t *)in_stack_fffffffffffffad0)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)in_stack_fffffffffffffaf0);
        in_stack_fffffffffffffafc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffafc);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb00);
          in_stack_fffffffffffffae8 =
               testing::AssertionResult::failure_message((AssertionResult *)0x8adadf);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     (char *)in_stack_fffffffffffffaf0,
                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffad0);
          testing::Message::~Message((Message *)0x8adb3c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8adb91);
      }
    }
  }
  aom_codec_destroy((aom_codec_ctx_t *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8)
                   );
  this_01 = local_4a0;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_fffffffffffffae8,
             (char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
             (aom_codec_err_t *)this_01,(aom_codec_err_t *)in_stack_fffffffffffffad0);
  line = (int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffae4);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb00);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x8adc78)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
               (char *)in_stack_fffffffffffffaf0,line,
               (char *)CONCAT44(uVar2,in_stack_fffffffffffffae0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x8adcd5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x8add2a);
  return;
}

Assistant:

TEST(LevelTest, TestTargetLevelApi) {
  aom_codec_iface_t *codec = aom_codec_av1_cx();
  aom_codec_ctx_t enc;
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(codec, &cfg, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, codec, &cfg, 0));
  for (int operating_point = 0; operating_point <= 32; ++operating_point) {
    for (int level = 0; level <= 32; ++level) {
      const int target_level = operating_point * 100 + level;
      if (operating_point <= 31 &&
          ((level < (CONFIG_CWG_C013 ? 28 : 20) && level != 2 && level != 3 &&
            level != 6 && level != 7 && level != 10 && level != 11) ||
           level == kLevelMax || level == kLevelKeepStats)) {
        EXPECT_EQ(AOM_CODEC_OK,
                  AOM_CODEC_CONTROL_TYPECHECKED(
                      &enc, AV1E_SET_TARGET_SEQ_LEVEL_IDX, target_level));
      } else {
        EXPECT_EQ(AOM_CODEC_INVALID_PARAM,
                  AOM_CODEC_CONTROL_TYPECHECKED(
                      &enc, AV1E_SET_TARGET_SEQ_LEVEL_IDX, target_level));
      }
    }
  }
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}